

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O0

void __thiscall ddd::Query::Query(Query *this,char *key)

{
  char *key_local;
  Query *this_local;
  
  this->key_ = key;
  this->pos_ = 0;
  this->value_ = 0x7fffffff;
  this->node_pos_ = 0;
  this->is_finished_ = false;
  return;
}

Assistant:

Query(const char* key) : key_{key} {}